

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O1

void __thiscall Timidity::Renderer::adjust_pressure(Renderer *this,int chan,int note,int amount)

{
  long *plVar1;
  Voice *pVVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (long)this->voices;
  if (lVar3 != 0) {
    lVar4 = lVar3 * 0x170;
    do {
      while( true ) {
        lVar3 = lVar3 + -1;
        pVVar2 = this->voice;
        if (((((&pVVar2[-1].status)[lVar4] & 1) == 0) ||
            ((uint)(&pVVar2[-1].channel)[lVar4] != chan)) ||
           ((uint)(&pVVar2[-1].note)[lVar4] != note)) break;
        (&pVVar2[-1].velocity)[lVar4] = (BYTE)amount;
        recompute_amp(this,(Voice *)(&pVVar2[-1].status + lVar4));
        apply_envelope_to_amp((Voice *)(&this->voice[-1].status + lVar4));
        if (lVar3 == 0) {
          return;
        }
        plVar1 = (long *)((long)&this->voice[-1].sample + lVar4);
        lVar4 = lVar4 + -0x170;
        if (*(char *)(*plVar1 + 0x50) == '\0') {
          return;
        }
      }
      lVar4 = lVar4 + -0x170;
    } while (lVar3 != 0);
  }
  return;
}

Assistant:

void Renderer::adjust_pressure(int chan, int note, int amount)
{
	int i = voices;
	while (i--)
	{
		if ((voice[i].status & VOICE_RUNNING) &&
			voice[i].channel == chan &&
			voice[i].note == note)
		{
			voice[i].velocity = amount;
			recompute_amp(&voice[i]);
			apply_envelope_to_amp(&voice[i]);
			if (!(voice[i].sample->self_nonexclusive))
			{
				return;
			}
		}
	}
}